

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)>::TypedExpectation
          (TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)> *this,
          FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  linked_ptr_internal *this_00;
  MatcherInterface<TestCallExprBuilder> *pMVar1;
  MatcherInterface<const_std::tuple<TestCallExprBuilder>_&> *pMVar2;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002f9b10;
  this->owner_ = owner;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
  super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestCallExprBuilder>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f1eb0;
  pMVar1 = (m->super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>).
           super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl.
           super_MatcherBase<TestCallExprBuilder>.impl_.value_;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
  super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestCallExprBuilder>.impl_.value_ = pMVar1;
  this_00 = &(this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
             super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl.
             super_MatcherBase<TestCallExprBuilder>.impl_.link_;
  if (pMVar1 == (MatcherInterface<TestCallExprBuilder> *)0x0) {
    this_00->next_ = this_00;
  }
  else {
    linked_ptr_internal::join
              (this_00,&(m->super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>).
                        super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>.
                        _M_head_impl.super_MatcherBase<TestCallExprBuilder>.impl_.link_);
  }
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
  super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestCallExprBuilder>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f1e68;
  pMVar2 = (MatcherInterface<const_std::tuple<TestCallExprBuilder>_&> *)operator_new(8);
  (pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002f9b90;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestCallExprBuilder>_&>.impl_.value_ =
       pMVar2;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestCallExprBuilder>_&>.impl_.link_.
  next_ = &(this->extra_matcher_).super_MatcherBase<const_std::tuple<TestCallExprBuilder>_&>.impl_.
           link_;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<TestCallExprBuilder>_&>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f9b58;
  (this->repeated_action_).impl_.value_ =
       (ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)> *)0x0;
  (this->repeated_action_).impl_.link_.next_ = &(this->repeated_action_).impl_.link_;
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}